

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_kmgmt.c
# Opt level: O0

OSSL_PARAM * dsa_imexport_types(int selection)

{
  int type_select;
  int selection_local;
  
  type_select = (int)((selection & 0x84U) != 0);
  if ((selection & 3U) != 0) {
    type_select = type_select + 2;
  }
  return dsa_types[type_select];
}

Assistant:

static const OSSL_PARAM *dsa_imexport_types(int selection)
{
    int type_select = 0;

    if ((selection & OSSL_KEYMGMT_SELECT_ALL_PARAMETERS) != 0)
        type_select += 1;
    if ((selection & OSSL_KEYMGMT_SELECT_KEYPAIR) != 0)
        type_select += 2;
    return dsa_types[type_select];
}